

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
args::Command::GetCommandProgramLine_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Command *this,HelpParams *params)

{
  bool bVar1;
  byte bVar2;
  Base **ppBVar3;
  const_iterator __position;
  pointer pcVar4;
  size_type sVar5;
  int iVar6;
  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  _Var7;
  undefined8 *puVar8;
  ulong *puVar9;
  pointer __args;
  long lVar10;
  ulong uVar11;
  size_type sVar12;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  group_res;
  value_type local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  UpdateSubparserHelp(this,params);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->subparserHasFlag == false) {
    ppBVar3 = (this->super_Group).children.
              super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<args::Base*const*,std::vector<args::Base*,std::allocator<args::Base*>>>,__gnu_cxx::__ops::_Iter_pred<args::Group::HasFlag()const::_lambda(args::Base*)_1_>>
                      ((this->super_Group).children.
                       super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                       super__Vector_impl_data._M_start,ppBVar3);
    if (_Var7._M_current == ppBVar3) goto LAB_00194e15;
  }
  if ((params->showProglineOptions == true) && (params->proglineShowFlags == false)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&params->proglineOptions);
  }
LAB_00194e15:
  Group::GetProgramLine_abi_cxx11_(&local_68,&this->super_Group,params);
  lVar10 = (long)local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (0 < lVar10) {
    uVar11 = lVar10 + 1;
    __args = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,__args);
      __args = __args + 1;
      uVar11 = uVar11 - 1;
    } while (1 < uVar11);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (this->subparserProgramLine).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->subparserProgramLine).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((params->proglineCommand)._M_string_length != 0) {
    ppBVar3 = (this->super_Group).children.
              super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    _Var7 = std::
            __find_if<__gnu_cxx::__normal_iterator<args::Base*const*,std::vector<args::Base*,std::allocator<args::Base*>>>,__gnu_cxx::__ops::_Iter_pred<args::Group::HasCommand()const::_lambda(args::Base*)_1_>>
                      ((this->super_Group).children.
                       super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                       super__Vector_impl_data._M_start,ppBVar3);
    if ((_Var7._M_current != ppBVar3) || (this->subparserHasCommand == true)) {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      bVar1 = this->commandIsRequired;
      if (bVar1 == true) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        pcVar4 = (params->proglineCommand)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar4,pcVar4 + (params->proglineCommand)._M_string_length);
      }
      else {
        std::operator+(&local_50,"[",&params->proglineCommand);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        puVar9 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_a8.field_2._M_allocated_capacity = *puVar9;
          local_a8.field_2._8_8_ = puVar8[3];
        }
        else {
          local_a8.field_2._M_allocated_capacity = *puVar9;
          local_a8._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_a8._M_string_length = puVar8[1];
        *puVar8 = puVar9;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(__return_storage_ptr__,__position,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if ((bVar1 == false) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  if ((this->name)._M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(__return_storage_ptr__,
             (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&this->name);
  }
  sVar5 = (this->proglinePostfix)._M_string_length;
  if (sVar5 != 0) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity =
         local_a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pcVar4 = (this->proglinePostfix)._M_dataplus._M_p;
    sVar12 = 0;
    do {
      bVar2 = pcVar4[sVar12];
      iVar6 = isspace((uint)bVar2);
      if (iVar6 == 0) {
        std::__cxx11::string::push_back((char)&local_a8);
      }
      else {
        if (local_a8._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_a8);
          local_a8._M_string_length = 0;
          *local_a8._M_dataplus._M_p = '\0';
        }
        if (bVar2 == 10) {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"\n","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
        }
      }
      sVar12 = sVar12 + 1;
    } while (sVar5 != sVar12);
    if (local_a8._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> GetCommandProgramLine(const HelpParams &params) const
            {
                UpdateSubparserHelp(params);

                std::vector<std::string> res;

                if ((subparserHasFlag || Group::HasFlag()) && params.showProglineOptions && !params.proglineShowFlags)
                {
                    res.push_back(params.proglineOptions);
                }

                auto group_res = Group::GetProgramLine(params);
                std::move(std::move(group_res).begin(), std::move(group_res).end(), std::back_inserter(res));

                res.insert(res.end(), subparserProgramLine.begin(), subparserProgramLine.end());

                if (!params.proglineCommand.empty() && (Group::HasCommand() || subparserHasCommand))
                {
                    res.insert(res.begin(), commandIsRequired ? params.proglineCommand : "[" + params.proglineCommand + "]");
                }

                if (!Name().empty())
                {
                    res.insert(res.begin(), Name());
                }

                if (!ProglinePostfix().empty())
                {
                    std::string line;
                    for (auto c : ProglinePostfix())
                    {
                        if (std::isspace(static_cast<unsigned char>(c)))
                        {
                            if (!line.empty())
                            {
                                res.push_back(line);
                                line.clear();
                            }

                            if (c == '\n')
                            {
                                res.push_back("\n");
                            }
                        }
                        else
                        {
                            line += c;
                        }
                    }

                    if (!line.empty())
                    {
                        res.push_back(line);
                    }
                }

                return res;
            }